

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_twiceCalledWithSameParameters_Test::testBody
          (TEST_MockParameterTest_twiceCalledWithSameParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SimpleString SStack_48;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_38,1);
  SimpleString::SimpleString(&SStack_48,"p2");
  (**(code **)(*plVar3 + 0x58))(plVar3,&SStack_48,2);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_38,1);
  SimpleString::SimpleString(&SStack_48,"p2");
  (**(code **)(*plVar3 + 0x58))(plVar3,&SStack_48,2);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar1),&local_38,1);
  SimpleString::SimpleString(&SStack_48,"p2");
  (**(code **)(*plVar3 + 0x40))(plVar3,&SStack_48,2);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_02,iVar1),&local_38,1);
  SimpleString::SimpleString(&SStack_48,"p2");
  (**(code **)(*plVar3 + 0x40))(plVar3,&SStack_48,2);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_18);
  return;
}

Assistant:

TEST(MockParameterTest, twiceCalledWithSameParameters)
{
    mock().expectOneCall("foo").withParameter("p1", 1).withParameter("p2", 2);
    mock().expectOneCall("foo").withParameter("p1", 1).withParameter("p2", 2);
    mock().actualCall("foo").withParameter("p1", 1).withParameter("p2", 2);
    mock().actualCall("foo").withParameter("p1", 1).withParameter("p2", 2);

    mock().checkExpectations();
}